

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionJITTimeInfo.cpp
# Opt level: O2

FunctionJITTimeInfo * __thiscall
FunctionJITTimeInfo::GetInlinee(FunctionJITTimeInfo *this,ProfileId profileId)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  FunctionJITTimeDataIDL **ppFVar4;
  FunctionJITTimeDataIDL *pFVar5;
  undefined6 in_register_00000032;
  
  if (((this->m_data).bodyData)->profiledCallSiteCount <= profileId) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionJITTimeInfo.cpp"
                       ,0x19e,"(profileId < m_data.bodyData->profiledCallSiteCount)",
                       "profileId < m_data.bodyData->profiledCallSiteCount");
    if (!bVar2) goto LAB_00415dbe;
    *puVar3 = 0;
  }
  ppFVar4 = (this->m_data).inlinees;
  if (ppFVar4 == (FunctionJITTimeDataIDL **)0x0) {
    pFVar5 = (FunctionJITTimeDataIDL *)0x0;
  }
  else {
    if ((this->m_data).inlineeCount <= (uint)CONCAT62(in_register_00000032,profileId)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionJITTimeInfo.cpp"
                         ,0x1a3,"(profileId < m_data.inlineeCount)",
                         "profileId < m_data.inlineeCount");
      if (!bVar2) {
LAB_00415dbe:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
      ppFVar4 = (this->m_data).inlinees;
    }
    pFVar5 = ppFVar4[profileId];
    if ((ppFVar4[profileId] == (FunctionJITTimeDataIDL *)0x0) &&
       (pFVar5 = (FunctionJITTimeDataIDL *)0x0,
       (this->m_data).inlineesRecursionFlags[profileId] != '\0')) {
      pFVar5 = &this->m_data;
    }
  }
  return (FunctionJITTimeInfo *)pFVar5;
}

Assistant:

const FunctionJITTimeInfo *
FunctionJITTimeInfo::GetInlinee(Js::ProfileId profileId) const
{
    Assert(profileId < m_data.bodyData->profiledCallSiteCount);
    if (!m_data.inlinees)
    {
        return nullptr;
    }
    AssertOrFailFast(profileId < m_data.inlineeCount);

    auto inlinee = reinterpret_cast<const FunctionJITTimeInfo *>(m_data.inlinees[profileId]);
    if (inlinee == nullptr && m_data.inlineesRecursionFlags[profileId])
    {
        inlinee = this;
    }
    return inlinee;
}